

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarfproc.cc
# Opt level: O2

uintptr_t __thiscall pstack::Procman::StackFrame::getFrameBase(StackFrame *this,Process *p)

{
  DIE *pDVar1;
  Addr reloc;
  undefined1 local_c0 [8];
  ExpressionStack stack;
  Attribute base;
  long local_40;
  undefined1 local_38 [8];
  ProcessLocation location;
  
  scopeIP((ProcessLocation *)local_38,this,p);
  pDVar1 = ProcessLocation::die((ProcessLocation *)local_38);
  if ((pDVar1->raw).super___shared_ptr<pstack::Dwarf::DIE::Raw,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      != (element_type *)0x0) {
    pstack::Dwarf::DIE::attribute((int)&stack + DW_AT_data_location,SUB81(pDVar1,0));
    if (local_40 != 0) {
      ExpressionStack::ExpressionStack((ExpressionStack *)local_c0);
      if (location.location_ == 0) {
        reloc = 0;
      }
      else {
        reloc = (long)local_38 - *(long *)location.location_;
      }
      this = (StackFrame *)
             ExpressionStack::eval
                       ((ExpressionStack *)local_c0,p,(Attribute *)&stack.isValue,this,reloc);
      std::_Deque_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Deque_base
                ((_Deque_base<unsigned_long,_std::allocator<unsigned_long>_> *)local_c0);
    }
    Dwarf::DIE::~DIE((DIE *)&stack.isValue);
    if (local_40 != 0) goto LAB_0013e195;
  }
  this = (StackFrame *)0x0;
LAB_0013e195:
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&location.codeloc);
  return (uintptr_t)this;
}

Assistant:

uintptr_t
StackFrame::getFrameBase(Process &p) const
{
    ProcessLocation location = scopeIP(p);
    const Dwarf::DIE &f = location.die();
    if (f) {
        auto base = f.attribute(Dwarf::DW_AT_frame_base);
        if (base.valid()) {
            ExpressionStack stack;
            return stack.eval(p, base, this, location.elfReloc());
        }
    }
    return 0;
}